

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

string * __thiscall
pbrt::SpotLight::ToString_abi_cxx11_(string *__return_storage_ptr__,SpotLight *this)

{
  string local_40;
  
  LightBase::BaseToString_abi_cxx11_(&local_40,&this->super_LightBase);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<std::__cxx11::string,pbrt::DenselySampledSpectrum_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             "[ SpotLight %s Iemit: %s cosFalloffStart: %f cosFalloffEnd: %f ]",&local_40,
             &this->Iemit,&this->cosFalloffStart,&this->cosFalloffEnd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SpotLight::ToString() const {
    return StringPrintf(
        "[ SpotLight %s Iemit: %s cosFalloffStart: %f cosFalloffEnd: %f ]",
        BaseToString(), Iemit, cosFalloffStart, cosFalloffEnd);
}